

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bandpre.c
# Opt level: O3

int ARKBandPrecGetWorkSpace(void *arkode_mem,long *lenrwBP,long *leniwBP)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  long liw;
  long lrw;
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  sunindextype liw1;
  sunindextype lrw1;
  long local_60;
  long local_58;
  ARKodeMem local_50;
  ARKLsMem local_48;
  long local_40;
  long local_38;
  
  iVar2 = arkLs_AccessARKODELMem(arkode_mem,"ARKBandPrecGetWorkSpace",&local_50,&local_48);
  if (iVar2 == 0) {
    pvVar1 = local_48->P_data;
    if (pvVar1 == (void *)0x0) {
      iVar2 = -5;
      arkProcessError(local_50,-5,0xd3,"ARKBandPrecGetWorkSpace",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                      ,"Band preconditioner memory is NULL. ARKBandPrecInit must be called.");
    }
    else {
      *leniwBP = 4;
      *lenrwBP = 0;
      if (local_50->tempv1->ops->nvspace !=
          (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
        N_VSpace(local_50->tempv1,&local_38,&local_40);
        *leniwBP = *leniwBP + local_40 * 2;
        *lenrwBP = *lenrwBP + local_38 * 2;
      }
      if (*(long *)(*(long *)(*(long *)((long)pvVar1 + 0x18) + 8) + 0x48) != 0) {
        iVar2 = SUNMatSpace(*(long *)((long)pvVar1 + 0x18),&local_58,&local_60);
        if (iVar2 == 0) {
          *leniwBP = *leniwBP + local_60;
          *lenrwBP = *lenrwBP + local_58;
        }
      }
      if (*(long *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 8) + 0x48) != 0) {
        iVar2 = SUNMatSpace(*(long *)((long)pvVar1 + 0x20),&local_58,&local_60);
        if (iVar2 == 0) {
          *leniwBP = *leniwBP + local_60;
          *lenrwBP = *lenrwBP + local_58;
        }
      }
      iVar2 = 0;
      if (*(long *)(*(long *)(*(long *)((long)pvVar1 + 0x28) + 8) + 0x60) != 0) {
        iVar3 = SUNLinSolSpace(*(long *)((long)pvVar1 + 0x28),&local_58,&local_60);
        if (iVar3 == 0) {
          *leniwBP = *leniwBP + local_60;
          *lenrwBP = *lenrwBP + local_58;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int ARKBandPrecGetWorkSpace(void* arkode_mem, long int* lenrwBP, long int* leniwBP)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBandPrecData pdata;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* access ARKodeMem and ARKLsMem structures */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return immediately if ARKBandPrecData is NULL */
  if (arkls_mem->P_data == NULL)
  {
    arkProcessError(ark_mem, ARKLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_BP_PMEM_NULL);
    return (ARKLS_PMEM_NULL);
  }
  pdata = (ARKBandPrecData)arkls_mem->P_data;

  /* sum space requirements for all objects in pdata */
  *leniwBP = 4;
  *lenrwBP = 0;
  if (ark_mem->tempv1->ops->nvspace)
  {
    N_VSpace(ark_mem->tempv1, &lrw1, &liw1);
    *leniwBP += 2 * liw1;
    *lenrwBP += 2 * lrw1;
  }
  if (pdata->savedJ->ops->space)
  {
    retval = SUNMatSpace(pdata->savedJ, &lrw, &liw);
    if (retval == 0)
    {
      *leniwBP += liw;
      *lenrwBP += lrw;
    }
  }
  if (pdata->savedP->ops->space)
  {
    retval = SUNMatSpace(pdata->savedP, &lrw, &liw);
    if (retval == 0)
    {
      *leniwBP += liw;
      *lenrwBP += lrw;
    }
  }
  if (pdata->LS->ops->space)
  {
    retval = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    if (retval == SUN_SUCCESS)
    {
      *leniwBP += liw;
      *lenrwBP += lrw;
    }
  }

  return (ARKLS_SUCCESS);
}